

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O1

string * get_host_name_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  utsname buf;
  utsname local_196;
  
  iVar1 = uname(&local_196);
  if (iVar1 != 0) {
    local_196.nodename[0] = '\0';
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_196.nodename);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string get_host_name() {
  struct utsname buf;
  if (0 != uname(&buf)) {
    *buf.nodename = '\0';
  }
  return std::string(buf.nodename);
}